

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen_unchanged.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  FILE *__stream;
  int iVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  undefined8 uVar7;
  int err;
  undefined1 local_24 [4];
  
  if (argc == 2) {
    pcVar1 = argv[1];
    lVar4 = zip_open(pcVar1,1,local_24);
    pcVar2 = teststr;
    if (lVar4 == 0) {
      main_cold_5();
      return 1;
    }
    sVar5 = strlen(teststr);
    lVar6 = zip_source_buffer(lVar4,pcVar2,sVar5,0);
    if (lVar6 == 0) {
      main_cold_4();
      halt_baddata();
    }
    lVar6 = zip_add(lVar4,file,lVar6);
    if (lVar6 == -1) {
      main_cold_3();
    }
    else {
      lVar6 = zip_fopen(lVar4,file,8);
      if (lVar6 == 0) {
        main_cold_2();
      }
      else {
        iVar3 = zip_close(lVar4);
        __stream = _stderr;
        if (iVar3 != -1) {
          return 0;
        }
        uVar7 = zip_strerror(lVar4);
        fprintf(__stream,"can\'t close zip archive \'%s\': %s\n",pcVar1,uVar7);
      }
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int
main(int argc, char *argv[]) {
    const char *archive;
    zip_t *za;
    zip_source_t *zs;
    int err;

    if (argc != 2) {
	fprintf(stderr, "usage: %s archive\n", argv[0]);
	return 1;
    }

    archive = argv[1];

    if ((za = zip_open(archive, ZIP_CREATE, &err)) == NULL) {
	zip_error_t error;
	zip_error_init_with_code(&error, err);
	fprintf(stderr, "can't open zip archive '%s': %s\n", archive, zip_error_strerror(&error));
	zip_error_fini(&error);
	return 1;
    }

    if ((zs = zip_source_buffer(za, teststr, strlen(teststr), 0)) == NULL) {
	fprintf(stderr, "can't create zip_source from buffer: %s\n", zip_strerror(za));
	exit(1);
    }

    if (zip_add(za, file, zs) == -1) {
	fprintf(stderr, "can't add file '%s': %s\n", file, zip_strerror(za));
	(void)zip_source_free(zs);
	(void)zip_close(za);
	return 1;
    }

    if (zip_fopen(za, file, ZIP_FL_UNCHANGED) == NULL) {
	fprintf(stderr, "can't zip_fopen file '%s': %s\n", file, zip_strerror(za));
	(void)zip_discard(za);
	return 1;
    }

    if (zip_close(za) == -1) {
	fprintf(stderr, "can't close zip archive '%s': %s\n", archive, zip_strerror(za));
	return 1;
    }

    return 0;
}